

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_strategy.h
# Opt level: O2

void __thiscall charls::encoder_strategy::flush(encoder_strategy *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  if (this->compressed_length_ < 4) {
    impl::throw_jpegls_error(UncompressedBufferTooSmall);
  }
  iVar2 = 4;
  while( true ) {
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) {
      return;
    }
    if (0x1f < this->free_bit_count_) break;
    iVar1 = 8 - (uint)this->is_ff_written_;
    *this->position_ = (uint8_t)(this->bit_buffer_ >> (this->is_ff_written_ + 0x18U & 0x1f));
    this->bit_buffer_ = this->bit_buffer_ << ((byte)iVar1 & 0x1f);
    this->free_bit_count_ = this->free_bit_count_ + iVar1;
    this->is_ff_written_ = *this->position_ == 0xff;
    this->position_ = this->position_ + 1;
    this->compressed_length_ = this->compressed_length_ - 1;
    this->bytes_written_ = this->bytes_written_ + 1;
  }
  this->free_bit_count_ = 0x20;
  return;
}

Assistant:

void flush()
    {
        if (UNLIKELY(compressed_length_ < 4))
            impl::throw_jpegls_error(jpegls_errc::destination_buffer_too_small);

        for (int i{}; i < 4; ++i)
        {
            if (free_bit_count_ >= 32)
            {
                free_bit_count_ = 32;
                break;
            }

            if (is_ff_written_)
            {
                // JPEG-LS requirement (T.87, A.1) to detect markers: after a xFF value a single 0 bit needs to be inserted.
                *position_ = static_cast<uint8_t>(bit_buffer_ >> 25);
                bit_buffer_ = bit_buffer_ << 7;
                free_bit_count_ += 7;
            }
            else
            {
                *position_ = static_cast<uint8_t>(bit_buffer_ >> 24);
                bit_buffer_ = bit_buffer_ << 8;
                free_bit_count_ += 8;
            }

            is_ff_written_ = *position_ == jpeg_marker_start_byte;
            ++position_;
            --compressed_length_;
            ++bytes_written_;
        }
    }